

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid)

{
  bool bVar1;
  FaceData *pFVar2;
  uint8_t *puVar3;
  Level *pLVar4;
  int in_ESI;
  PtexReader *in_RDI;
  FaceData *face;
  Level *level;
  FaceInfo *fi;
  reference in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int faceid_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb6;
  PtexReader *in_stack_ffffffffffffffb8;
  Res local_22;
  reference local_20;
  FaceData *local_8;
  
  if ((((in_RDI->_ok & 1U) == 0) || (in_ESI < 0)) ||
     ((ulong)(in_RDI->_header).nfaces <= (ulong)(long)in_ESI)) {
    local_8 = errorData((PtexReader *)
                        CONCAT26(in_stack_ffffffffffffffb6,
                                 CONCAT24(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
                        SUB81((ulong)in_RDI >> 0x38,0));
  }
  else {
    local_20 = std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::operator[]
                         (&in_RDI->_faceinfo,(long)in_ESI);
    bVar1 = FaceInfo::isConstant(local_20);
    faceid_00 = CONCAT13(1,(int3)in_stack_ffffffffffffffa4);
    if (!bVar1) {
      in_stack_ffffffffffffff98 = local_20;
      Res::Res(&local_22,0);
      bVar1 = Res::operator==(&in_stack_ffffffffffffff98->res,&local_22);
      faceid_00 = CONCAT13(bVar1,(int3)faceid_00);
    }
    if ((char)((uint)faceid_00 >> 0x18) == '\0') {
      pLVar4 = getLevel((PtexReader *)CONCAT44(faceid_00,in_stack_ffffffffffffffa0),
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      local_8 = getFace(in_stack_ffffffffffffffb8,CONCAT22(local_20->res,in_stack_ffffffffffffffb4),
                        (Level *)in_RDI,faceid_00,SUB82((ulong)pLVar4 >> 0x30,0));
    }
    else {
      pFVar2 = (FaceData *)operator_new(0x18);
      puVar3 = getConstData(in_RDI);
      ConstDataPtr::ConstDataPtr
                ((ConstDataPtr *)CONCAT44(faceid_00,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98,(int)((ulong)puVar3 >> 0x20));
      local_8 = pFVar2;
    }
  }
  return &local_8->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::getData(int faceid)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        return errorData(/*deleteOnRelease*/ true);
    }

    FaceInfo& fi = _faceinfo[faceid];
    if (fi.isConstant() || fi.res == 0) {
        return new ConstDataPtr(getConstData() + faceid * _pixelsize, _pixelsize);
    }

    // get level zero (full) res face
    Level* level = getLevel(0);
    FaceData* face = getFace(0, level, faceid, fi.res);
    return face;
}